

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O2

void Corrade::Utility::Implementation::flipSecondToLastDimensionInPlace
               (StridedArrayView4D<char> *view)

{
  undefined8 *__src;
  undefined8 *__src_00;
  ErasedType *pEVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  unsigned_long uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  ulong uVar11;
  unsigned_long uVar12;
  ostream *output;
  unsigned_long uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  char tmp [32];
  Error local_80 [2];
  
  bVar10 = Containers::StridedArrayView<4u,char>::isContiguous<3u>
                     ((StridedArrayView<4u,char> *)view);
  if (bVar10) {
    pEVar1 = view->_data;
    for (uVar12 = 0; uVar12 != (view->_size)._data[0]; uVar12 = uVar12 + 1) {
      lVar2 = (view->_stride)._data[0];
      for (uVar13 = 0; uVar13 != (view->_size)._data[1]; uVar13 = uVar13 + 1) {
        lVar3 = (view->_stride)._data[1];
        uVar4 = (view->_size)._data[2];
        lVar16 = -1;
        for (uVar14 = 0; uVar14 != uVar4 >> 1; uVar14 = uVar14 + 1) {
          lVar5 = (view->_stride)._data[2];
          uVar11 = (view->_size)._data[3] >> 5;
          uVar6 = (view->_size)._data[2];
          lVar15 = (long)pEVar1 + lVar3 * uVar13 + lVar2 * uVar12;
          while( true ) {
            __src = (undefined8 *)(lVar15 + lVar5 * uVar14);
            __src_00 = (undefined8 *)(lVar15 + (uVar6 + lVar16) * lVar5);
            bVar10 = uVar11 == 0;
            uVar11 = uVar11 - 1;
            if (bVar10) break;
            local_80[0].super_Debug._output = (ostream *)*__src;
            local_80[0].super_Debug._8_8_ = __src[1];
            local_80[0].super_Debug._sourceLocationFile = (char *)__src[2];
            local_80[0].super_Debug._previousGlobalOutput = (ostream *)__src[3];
            uVar7 = *__src_00;
            uVar8 = __src_00[1];
            uVar9 = __src_00[3];
            __src[2] = __src_00[2];
            __src[3] = uVar9;
            *__src = uVar7;
            __src[1] = uVar8;
            __src_00[2] = local_80[0].super_Debug._sourceLocationFile;
            __src_00[3] = local_80[0].super_Debug._previousGlobalOutput;
            *__src_00 = local_80[0].super_Debug._output;
            __src_00[1] = local_80[0].super_Debug._8_8_;
            lVar15 = lVar15 + 0x20;
          }
          uVar11 = (ulong)((uint)(view->_size)._data[3] & 0x1f);
          memcpy(local_80,__src,uVar11);
          memcpy(__src,__src_00,uVar11);
          memcpy(__src_00,local_80,uVar11);
          lVar16 = lVar16 + -1;
        }
      }
    }
    return;
  }
  output = Error::defaultOutput();
  Error::Error(local_80,output,(Flags)0x0);
  Debug::operator<<(&local_80[0].super_Debug,
                    "Assertion view.isContiguous<3>() failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Algorithms.cpp:232"
                   );
  Error::~Error(local_80);
  abort();
}

Assistant:

void flipSecondToLastDimensionInPlace(const Containers::StridedArrayView4D<char>& view) {
    /* Should have been checked by flipInPlace() already, just verifying that
       all the bubbling back to four dimensions went correct */
    CORRADE_INTERNAL_ASSERT(view.isContiguous<3>());

    auto* const ptr = static_cast<char*>(view.data());
    const std::size_t* size = view.size().begin();
    const std::ptrdiff_t* stride = view.stride().begin();

    for(std::size_t i0 = 0; i0 != size[0]; ++i0) {
        char* const ptr0 = ptr + i0*stride[0];
        for(std::size_t i1 = 0; i1 != size[1]; ++i1) {
            char* const ptr1 = ptr0 + i1*stride[1];

            /* Go through half of the items in third dimension and flip them
               with the other half */
            for(std::size_t i2 = 0, i2Max = size[2]/2; i2 != i2Max; ++i2) {
                char* const ptr2Left = ptr1 + i2*stride[2];
                char* const ptr2Right = ptr1 + (size[2] - i2 - 1)*stride[2];

                /* Copy 256-bit blocks at a time, which could hopefully make
                   use of 256-bit SIMD */
                constexpr std::size_t BlockSize = 32;
                alignas(BlockSize) char tmp[BlockSize];
                char* ptr3Left = ptr2Left;
                char* ptr3Right = ptr2Right;
                for(std::size_t i3 = 0, i3Max = size[3]/BlockSize; i3 != i3Max; ++i3) {
                    std::memcpy(tmp, ptr3Left, BlockSize);
                    std::memcpy(ptr3Left, ptr3Right, BlockSize);
                    std::memcpy(ptr3Right, tmp, BlockSize);

                    ptr3Left += BlockSize;
                    ptr3Right += BlockSize;
                }

                /* Copy the rest. I doubt an if() around this makes sense,
                   since it would slow down the very common and very slow case
                   where we're flipping pieces of data smaller than 256 bits */
                const std::size_t remainingSize = size[3]%BlockSize;
                std::memcpy(tmp, ptr3Left, remainingSize);
                std::memcpy(ptr3Left, ptr3Right, remainingSize);
                std::memcpy(ptr3Right, tmp, remainingSize);
            }
        }
    }
}